

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O3

Value * EncodeFilename(Value *__return_storage_ptr__,string *path)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  Value *extraout_RAX;
  Value *pVVar5;
  char cVar6;
  size_type sVar7;
  string data;
  char buf [5];
  String local_60;
  Value *local_40;
  char local_35 [5];
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40 = __return_storage_ptr__;
  std::__cxx11::string::reserve((ulong)&local_60);
  sVar2 = path->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (path->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      cVar1 = pcVar3[sVar7];
      iVar4 = iscntrl((int)cVar1);
      if (iVar4 == 0) {
        cVar6 = (char)&local_60;
        if ((cVar1 == '\\') || (cVar1 == '\"')) {
          std::__cxx11::string::push_back(cVar6);
        }
        std::__cxx11::string::push_back(cVar6);
      }
      else {
        std::__cxx11::string::append((char *)&local_60);
        snprintf(local_35,5,"%04x",(ulong)(uint)(int)pcVar3[sVar7]);
        std::__cxx11::string::append((char *)&local_60);
      }
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  Json::Value::Value(local_40,&local_60);
  pVVar5 = (Value *)&local_60.field_2;
  if ((Value *)local_60._M_dataplus._M_p != pVVar5) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
    pVVar5 = extraout_RAX;
  }
  return pVVar5;
}

Assistant:

static Json::Value EncodeFilename(std::string const& path)
{
  std::string data;
  data.reserve(path.size());

  for (auto const& byte : path) {
    if (std::iscntrl(byte)) {
      // Control characters.
      data.append("\\u");
      char buf[5];
      std::snprintf(buf, sizeof(buf), "%04x", byte);
      data.append(buf);
    } else if (byte == '"' || byte == '\\') {
      // Special JSON characters.
      data.push_back('\\');
      data.push_back(byte);
    } else {
      // Other data.
      data.push_back(byte);
    }
  }

  return data;
}